

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramOutputTestGroup::init
          (ProgramOutputTestGroup *this,EVP_PKEY_CTX *ctx)

{
  ContextType type;
  GLSLVersion glslVersion_00;
  int extraout_EAX;
  RenderContext *pRVar1;
  TestNode *pTVar2;
  TestCaseGroup *blockGroup_6;
  TestCaseGroup *blockGroup_5;
  TestCaseGroup *blockGroup_4;
  TestCaseGroup *blockGroup_3;
  TestCaseGroup *blockGroup_2;
  TestCaseGroup *blockGroup_1;
  TestCaseGroup *blockGroup;
  GLSLVersion glslVersion;
  ProgramOutputTestGroup *this_local;
  
  pRVar1 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  glslVersion_00 = glu::getContextTypeGLSLVersion(type);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "resource_list","Resource list");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,true,false
             ,generateProgramOutputResourceListBlockContents);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"array_size",
             "Array size");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,false,
             false,
             generateProgramOutputBasicBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
            );
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"location",
             "Location");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,false,
             false,generateProgramOutputLocationBlockContents);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"name_length",
             "Name length");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,false,
             false,
             generateProgramOutputBasicBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)256>
            );
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "referenced_by","Reference by shader");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateProgramInputOutputReferencedByCases
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,STORAGE_OUT);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"type","Type")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,false,
             false,generateProgramOutputTypeBlockContents);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"is_per_patch"
             ,"Is per patch");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,false,
             false,
             generateProgramOutputBasicBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)131072>
            );
  return extraout_EAX;
}

Assistant:

void ProgramOutputTestGroup::init (void)
{
	const glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	// .resource_list
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "resource_list", "Resource list");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, true, false, generateProgramOutputResourceListBlockContents);
	}

	// .array_size
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "array_size", "Array size");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputBasicBlockContents<PROGRAMRESOURCEPROP_ARRAY_SIZE>);
	}

	// .location
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "location", "Location");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputLocationBlockContents);
	}

	// .name_length
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "name_length", "Name length");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputBasicBlockContents<PROGRAMRESOURCEPROP_NAME_LENGTH>);
	}

	// .referenced_by
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "referenced_by", "Reference by shader");
		addChild(blockGroup);
		generateProgramInputOutputReferencedByCases(m_context, blockGroup, glu::STORAGE_OUT);
	}

	// .type
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "type", "Type");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputTypeBlockContents);
	}

	// .is_per_patch
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "is_per_patch", "Is per patch");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputBasicBlockContents<PROGRAMRESOURCEPROP_IS_PER_PATCH>);
	}
}